

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_ASAi_dns.c
# Opt level: O3

void PrintOutput(sunrealtype tfinal,N_Vector yB,N_Vector ypB)

{
  printf("dG/dy0: \t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n",yB->content,yB->ops,
         yB->sunctx,yB[1].content,yB[1].ops);
  puts("--------------------------------------------------------\n");
  return;
}

Assistant:

static void PrintOutput(sunrealtype tfinal, N_Vector yB, N_Vector ypB)
{
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("dG/dy0: "
         "\t%12.4Le\n\t\t%12.4Le\n\t\t%12.4Le\n\t\t%12.4Le\n\t\t%12.4Le\n",
#else
  printf("dG/dy0: \t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n",
#endif
         Ith(yB, 1), Ith(yB, 2), Ith(yB, 3), Ith(yB, 4), Ith(yB, 5));
  printf("--------------------------------------------------------\n\n");
}